

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall parser::~parser(parser *this)

{
  if (this->input != (io_buf *)0x0) {
    (*this->input->_vptr_io_buf[3])();
  }
  if (this->output != (io_buf *)0x0) {
    (*this->output->_vptr_io_buf[3])();
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->jsonp).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::condition_variable::~condition_variable(&this->output_done);
  VW::ptr_queue<example>::~ptr_queue(&this->ready_parsed_examples);
  VW::object_pool<example,_example_initializer>::~object_pool(&this->example_pool);
  return;
}

Assistant:

~parser()
  {
    delete input;
    delete output;
  }